

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void init_glow(void)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  
  init_sprite(&glow,6,512.0,600.0,1.0,1.0);
  glow.align_y = 1.0;
  glow.b = 0.0;
  glow.g = 0.0;
  glow.r = 0.0;
  fVar2 = 0.0;
  fVar3 = 0.0;
  init_sprite(&glow_overlay,7,0.0,0.0,1.0,1.0);
  glow_overlay.align_x = 0.0;
  glow_overlay.align_y = 0.0;
  glow_overlay.b = 0.0;
  glow_overlay.g = 0.0;
  glow_overlay.r = 0.0;
  uVar1 = al_map_rgb(0x6b,0x8e,0x23);
  glow_color[0].a = fVar3;
  glow_color[0].b = fVar2;
  glow_color[0].r = (float)(int)uVar1;
  glow_color[0].g = (float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = al_map_rgb(0xad,0xd8,0xe6);
  glow_color[1].a = fVar3;
  glow_color[1].b = fVar2;
  glow_color[1].r = (float)(int)uVar1;
  glow_color[1].g = (float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = al_map_rgb(0x41,0x69,0xe1);
  glow_color[2].a = fVar3;
  glow_color[2].b = fVar2;
  glow_color[2].r = (float)(int)uVar1;
  glow_color[2].g = (float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = al_map_rgb(0xff,0);
  glow_color[3].r = (float)uVar1;
  glow_color[3].g = SUB84(uVar1,4);
  glow_color[3].b = fVar2;
  glow_color[3].a = fVar3;
  return;
}

Assistant:

static void init_glow(void)
{
   init_sprite(&glow, IMG_GLOW, screen_w/2, screen_h, 1.0, 1.0);
   glow.align_y = 1.0;
   glow.r = glow.g = glow.b = 0.0;

   init_sprite(&glow_overlay, IMG_GLOW_OVERLAY, 0.0, 0.0, 1.0, 1.0);
   glow_overlay.align_x = 0.0;
   glow_overlay.align_y = 0.0;
   glow_overlay.r = glow_overlay.g = glow_overlay.b = 0.0;

   glow_color[TYPE_EARTH] = al_map_rgb(0x6b, 0x8e, 0x23); /* olivedrab */
   glow_color[TYPE_WIND]  = al_map_rgb(0xad, 0xd8, 0xe6); /* lightblue */
   glow_color[TYPE_WATER] = al_map_rgb(0x41, 0x69, 0xe1); /* royalblue */
   glow_color[TYPE_FIRE]  = al_map_rgb(0xff, 0x00, 0x00); /* red */
}